

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void __thiscall
btSoftBody::appendAnchor
          (btSoftBody *this,int node,btRigidBody *body,btVector3 *localPivot,
          bool disableCollisionBetweenLinkedBodies,btScalar influence)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  btCollisionObject **ptr;
  Node *pNVar8;
  Anchor *pAVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  btCollisionObject **ppbVar15;
  long lVar16;
  Anchor *pAVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  undefined3 in_register_00000081;
  int iVar21;
  
  if (CONCAT31(in_register_00000081,disableCollisionBetweenLinkedBodies) != 0) {
    uVar5 = (this->m_collisionDisabledObjects).m_size;
    if (0 < (int)uVar5) {
      uVar18 = 0;
      do {
        if ((btRigidBody *)(this->m_collisionDisabledObjects).m_data[uVar18] == body)
        goto LAB_001da561;
        uVar18 = uVar18 + 1;
      } while (uVar5 != uVar18);
    }
    uVar18 = (ulong)uVar5;
LAB_001da561:
    if ((uint)uVar18 == uVar5) {
      uVar6 = (this->m_collisionDisabledObjects).m_capacity;
      if (uVar5 == uVar6) {
        iVar21 = 1;
        if ((ulong)uVar5 != 0) {
          iVar21 = uVar5 * 2;
        }
        if ((int)uVar6 < iVar21) {
          if (iVar21 == 0) {
            ppbVar15 = (btCollisionObject **)0x0;
          }
          else {
            ppbVar15 = (btCollisionObject **)btAlignedAllocInternal((long)iVar21 << 3,0x10);
          }
          lVar16 = (long)(this->m_collisionDisabledObjects).m_size;
          if (0 < lVar16) {
            lVar19 = 0;
            do {
              ppbVar15[lVar19] = (this->m_collisionDisabledObjects).m_data[lVar19];
              lVar19 = lVar19 + 1;
            } while (lVar16 != lVar19);
          }
          ptr = (this->m_collisionDisabledObjects).m_data;
          if (ptr != (btCollisionObject **)0x0) {
            if ((this->m_collisionDisabledObjects).m_ownsMemory == true) {
              btAlignedFreeInternal(ptr);
            }
            (this->m_collisionDisabledObjects).m_data = (btCollisionObject **)0x0;
          }
          (this->m_collisionDisabledObjects).m_ownsMemory = true;
          (this->m_collisionDisabledObjects).m_data = ppbVar15;
          (this->m_collisionDisabledObjects).m_capacity = iVar21;
        }
      }
      iVar21 = (this->m_collisionDisabledObjects).m_size;
      (this->m_collisionDisabledObjects).m_data[iVar21] = &body->super_btCollisionObject;
      (this->m_collisionDisabledObjects).m_size = iVar21 + 1;
    }
  }
  pNVar8 = (this->m_nodes).m_data;
  uVar10 = *(undefined8 *)localPivot->m_floats;
  uVar11 = *(undefined8 *)(localPivot->m_floats + 2);
  puVar3 = &pNVar8[node].field_0x70;
  *puVar3 = *puVar3 | 1;
  iVar21 = (this->m_anchors).m_size;
  iVar7 = (this->m_anchors).m_capacity;
  if (iVar21 == iVar7) {
    iVar20 = 1;
    if (iVar21 != 0) {
      iVar20 = iVar21 * 2;
    }
    if (iVar7 < iVar20) {
      if (iVar20 == 0) {
        pAVar17 = (Anchor *)0x0;
      }
      else {
        pAVar17 = (Anchor *)btAlignedAllocInternal((long)iVar20 * 0x68,0x10);
      }
      lVar16 = (long)(this->m_anchors).m_size;
      if (0 < lVar16) {
        lVar19 = 0;
        do {
          pAVar9 = (this->m_anchors).m_data;
          *(undefined4 *)((long)(pAVar17->m_c0).m_el[0].m_floats + lVar19 + -4) =
               *(undefined4 *)((long)(pAVar9->m_c0).m_el[0].m_floats + lVar19 + -4);
          puVar2 = (undefined8 *)((long)(pAVar9->m_local).m_floats + lVar19 + -8);
          uVar12 = *puVar2;
          uVar13 = puVar2[1];
          puVar2 = (undefined8 *)((long)(pAVar9->m_local).m_floats + lVar19 + 8);
          uVar14 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pAVar17->m_local).m_floats + lVar19 + 8);
          *puVar4 = *puVar2;
          puVar4[1] = uVar14;
          puVar2 = (undefined8 *)((long)(pAVar17->m_local).m_floats + lVar19 + -8);
          *puVar2 = uVar12;
          puVar2[1] = uVar13;
          puVar2 = (undefined8 *)((long)(pAVar9->m_c0).m_el[0].m_floats + lVar19);
          uVar12 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pAVar17->m_c0).m_el[0].m_floats + lVar19);
          *puVar4 = *puVar2;
          puVar4[1] = uVar12;
          puVar2 = (undefined8 *)((long)(pAVar9->m_c0).m_el[1].m_floats + lVar19);
          uVar12 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pAVar17->m_c0).m_el[1].m_floats + lVar19);
          *puVar4 = *puVar2;
          puVar4[1] = uVar12;
          puVar2 = (undefined8 *)((long)(pAVar9->m_c0).m_el[2].m_floats + lVar19);
          uVar12 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pAVar17->m_c0).m_el[2].m_floats + lVar19);
          *puVar4 = *puVar2;
          puVar4[1] = uVar12;
          *(undefined4 *)((long)(&pAVar17->m_c1 + 1) + lVar19) =
               *(undefined4 *)((long)(&pAVar9->m_c1 + 1) + lVar19);
          puVar4 = (undefined8 *)((long)(pAVar9->m_c1).m_floats + lVar19);
          uVar12 = puVar4[1];
          puVar2 = (undefined8 *)((long)(pAVar17->m_c1).m_floats + lVar19);
          *puVar2 = *puVar4;
          puVar2[1] = uVar12;
          lVar19 = lVar19 + 0x68;
        } while (lVar16 * 0x68 - lVar19 != 0);
      }
      pAVar9 = (this->m_anchors).m_data;
      if (pAVar9 != (Anchor *)0x0) {
        if ((this->m_anchors).m_ownsMemory == true) {
          btAlignedFreeInternal(pAVar9);
        }
        (this->m_anchors).m_data = (Anchor *)0x0;
      }
      (this->m_anchors).m_ownsMemory = true;
      (this->m_anchors).m_data = pAVar17;
      (this->m_anchors).m_capacity = iVar20;
    }
  }
  pAVar17 = (this->m_anchors).m_data;
  iVar21 = (this->m_anchors).m_size;
  pAVar17[iVar21].m_node = pNVar8 + node;
  *(undefined8 *)pAVar17[iVar21].m_local.m_floats = uVar10;
  *(undefined8 *)(pAVar17[iVar21].m_local.m_floats + 2) = uVar11;
  pAVar17[iVar21].m_body = body;
  pAVar17[iVar21].m_influence = influence;
  piVar1 = &(this->m_anchors).m_size;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void			btSoftBody::appendAnchor(int node,btRigidBody* body, const btVector3& localPivot,bool disableCollisionBetweenLinkedBodies,btScalar influence)
{
	if (disableCollisionBetweenLinkedBodies)
	{
		if (m_collisionDisabledObjects.findLinearSearch(body)==m_collisionDisabledObjects.size())
		{
			m_collisionDisabledObjects.push_back(body);
		}
	}

	Anchor	a;
	a.m_node			=	&m_nodes[node];
	a.m_body			=	body;
	a.m_local			=	localPivot;
	a.m_node->m_battach	=	1;
	a.m_influence = influence;
	m_anchors.push_back(a);
}